

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O0

void google::protobuf::compiler::php::anon_unknown_2::GenerateEnumFile
               (FileDescriptor *file,EnumDescriptor *en,Options *options,
               GeneratorContext *generator_context)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  pointer output_00;
  string *psVar4;
  Descriptor *pDVar5;
  int32 value_00;
  string local_248;
  string local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  EnumValueDescriptor *local_1e8;
  EnumValueDescriptor *value_1;
  undefined1 local_1d8 [4];
  int i_1;
  string local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  EnumValueDescriptor *local_178;
  EnumValueDescriptor *value;
  string local_168 [4];
  int i;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  int local_124;
  undefined1 local_120 [4];
  int lastindex;
  string fullname;
  Printer printer;
  unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
  local_50;
  unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
  output;
  string filename;
  GeneratorContext *generator_context_local;
  Options *options_local;
  EnumDescriptor *en_local;
  FileDescriptor *file_local;
  
  GeneratedClassFileName<google::protobuf::EnumDescriptor>((string *)&output,en,options);
  iVar1 = (*generator_context->_vptr_GeneratorContext[2])(generator_context,(string *)&output);
  std::
  unique_ptr<google::protobuf::io::ZeroCopyOutputStream,std::default_delete<google::protobuf::io::ZeroCopyOutputStream>>
  ::unique_ptr<std::default_delete<google::protobuf::io::ZeroCopyOutputStream>,void>
            ((unique_ptr<google::protobuf::io::ZeroCopyOutputStream,std::default_delete<google::protobuf::io::ZeroCopyOutputStream>>
              *)&local_50,(pointer)CONCAT44(extraout_var,iVar1));
  output_00 = std::
              unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
              ::get(&local_50);
  io::Printer::Printer((Printer *)((long)&fullname.field_2 + 8),output_00,'^');
  GenerateHead(file,(Printer *)((long)&fullname.field_2 + 8));
  FilenameToClassname((string *)local_120,(string *)&output);
  local_124 = std::__cxx11::string::find_last_of(local_120,0x76cba7);
  if (local_124 != -1) {
    std::__cxx11::string::substr((ulong)&local_148,(ulong)local_120);
    io::Printer::Print<char[5],std::__cxx11::string>
              ((Printer *)((long)&fullname.field_2 + 8),"namespace ^name^;\n\n",
               (char (*) [5])0x77db8d,&local_148);
    std::__cxx11::string::~string((string *)&local_148);
    io::Printer::Print<>
              ((Printer *)((long)&fullname.field_2 + 8),"use UnexpectedValueException;\n\n");
  }
  GenerateEnumDocComment((Printer *)((long)&fullname.field_2 + 8),en,options);
  if (local_124 != -1) {
    std::__cxx11::string::substr((ulong)local_168,(ulong)local_120);
    std::__cxx11::string::operator=((string *)local_120,local_168);
    std::__cxx11::string::~string(local_168);
  }
  io::Printer::Print<char[5],std::__cxx11::string>
            ((Printer *)((long)&fullname.field_2 + 8),"class ^name^\n{\n",(char (*) [5])0x77db8d,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_120);
  Indent((Printer *)((long)&fullname.field_2 + 8));
  value._4_4_ = 0;
  while( true ) {
    iVar1 = value._4_4_;
    iVar2 = EnumDescriptor::value_count(en);
    if (iVar2 <= iVar1) break;
    local_178 = EnumDescriptor::value(en,value._4_4_);
    GenerateEnumValueDocComment((Printer *)((long)&fullname.field_2 + 8),local_178);
    psVar4 = EnumValueDescriptor::name_abi_cxx11_(local_178);
    ConstantNamePrefix(&local_1b8,psVar4);
    psVar4 = EnumValueDescriptor::name_abi_cxx11_(local_178);
    std::operator+(&local_198,&local_1b8,psVar4);
    uVar3 = EnumValueDescriptor::number(local_178);
    (anonymous_namespace)::IntToString_abi_cxx11_
              ((string *)local_1d8,(_anonymous_namespace_ *)(ulong)uVar3,value_00);
    io::Printer::Print<char[5],std::__cxx11::string,char[7],std::__cxx11::string>
              ((Printer *)((long)&fullname.field_2 + 8),"const ^name^ = ^number^;\n",
               (char (*) [5])0x77db8d,&local_198,(char (*) [7])0x79279d,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d8);
    std::__cxx11::string::~string((string *)local_1d8);
    std::__cxx11::string::~string((string *)&local_198);
    std::__cxx11::string::~string((string *)&local_1b8);
    value._4_4_ = value._4_4_ + 1;
  }
  io::Printer::Print<>
            ((Printer *)((long)&fullname.field_2 + 8),"\nprivate static $valueToName = [\n");
  Indent((Printer *)((long)&fullname.field_2 + 8));
  value_1._4_4_ = 0;
  while( true ) {
    iVar1 = value_1._4_4_;
    iVar2 = EnumDescriptor::value_count(en);
    if (iVar2 <= iVar1) break;
    local_1e8 = EnumDescriptor::value(en,value_1._4_4_);
    psVar4 = EnumValueDescriptor::name_abi_cxx11_(local_1e8);
    ConstantNamePrefix(&local_228,psVar4);
    psVar4 = EnumValueDescriptor::name_abi_cxx11_(local_1e8);
    std::operator+(&local_208,&local_228,psVar4);
    io::Printer::Print<char[5],std::__cxx11::string>
              ((Printer *)((long)&fullname.field_2 + 8),"self::^name^ => \'^name^\',\n",
               (char (*) [5])0x77db8d,&local_208);
    std::__cxx11::string::~string((string *)&local_208);
    std::__cxx11::string::~string((string *)&local_228);
    value_1._4_4_ = value_1._4_4_ + 1;
  }
  Outdent((Printer *)((long)&fullname.field_2 + 8));
  io::Printer::Print<>((Printer *)((long)&fullname.field_2 + 8),"];\n");
  io::Printer::Print<>
            ((Printer *)((long)&fullname.field_2 + 8),"\npublic static function name($value)\n{\n");
  Indent((Printer *)((long)&fullname.field_2 + 8));
  io::Printer::Print<>
            ((Printer *)((long)&fullname.field_2 + 8),"if (!isset(self::$valueToName[$value])) {\n")
  ;
  Indent((Printer *)((long)&fullname.field_2 + 8));
  io::Printer::Print<>
            ((Printer *)((long)&fullname.field_2 + 8),
             "throw new UnexpectedValueException(sprintf(\n");
  Indent((Printer *)((long)&fullname.field_2 + 8));
  Indent((Printer *)((long)&fullname.field_2 + 8));
  io::Printer::Print<>
            ((Printer *)((long)&fullname.field_2 + 8),
             "\'Enum %s has no name defined for value %s\', __CLASS__, $value));\n");
  Outdent((Printer *)((long)&fullname.field_2 + 8));
  Outdent((Printer *)((long)&fullname.field_2 + 8));
  Outdent((Printer *)((long)&fullname.field_2 + 8));
  io::Printer::Print<>
            ((Printer *)((long)&fullname.field_2 + 8),"}\nreturn self::$valueToName[$value];\n");
  Outdent((Printer *)((long)&fullname.field_2 + 8));
  io::Printer::Print<>((Printer *)((long)&fullname.field_2 + 8),"}\n\n");
  io::Printer::Print<>
            ((Printer *)((long)&fullname.field_2 + 8),"\npublic static function value($name)\n{\n");
  Indent((Printer *)((long)&fullname.field_2 + 8));
  io::Printer::Print<>
            ((Printer *)((long)&fullname.field_2 + 8),
             "$const = __CLASS__ . \'::\' . strtoupper($name);\nif (!defined($const)) {\n");
  Indent((Printer *)((long)&fullname.field_2 + 8));
  io::Printer::Print<>
            ((Printer *)((long)&fullname.field_2 + 8),
             "throw new UnexpectedValueException(sprintf(\n");
  Indent((Printer *)((long)&fullname.field_2 + 8));
  Indent((Printer *)((long)&fullname.field_2 + 8));
  io::Printer::Print<>
            ((Printer *)((long)&fullname.field_2 + 8),
             "\'Enum %s has no value defined for name %s\', __CLASS__, $name));\n");
  Outdent((Printer *)((long)&fullname.field_2 + 8));
  Outdent((Printer *)((long)&fullname.field_2 + 8));
  Outdent((Printer *)((long)&fullname.field_2 + 8));
  io::Printer::Print<>((Printer *)((long)&fullname.field_2 + 8),"}\nreturn constant($const);\n");
  Outdent((Printer *)((long)&fullname.field_2 + 8));
  io::Printer::Print<>((Printer *)((long)&fullname.field_2 + 8),"}\n");
  Outdent((Printer *)((long)&fullname.field_2 + 8));
  io::Printer::Print<>((Printer *)((long)&fullname.field_2 + 8),"}\n\n");
  pDVar5 = EnumDescriptor::containing_type(en);
  if (pDVar5 != (Descriptor *)0x0) {
    io::Printer::Print<>
              ((Printer *)((long)&fullname.field_2 + 8),
               "// Adding a class alias for backwards compatibility with the previous class name.\n"
              );
    LegacyFullClassName<google::protobuf::EnumDescriptor>(&local_248,en,options);
    io::Printer::Print<char[4],std::__cxx11::string,char[4],std::__cxx11::string>
              ((Printer *)((long)&fullname.field_2 + 8),
               "class_alias(^new^::class, \\^old^::class);\n\n",(char (*) [4])"new",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_120,
               (char (*) [4])"old",&local_248);
    std::__cxx11::string::~string((string *)&local_248);
    LegacyGenerateClassFile<google::protobuf::EnumDescriptor>(file,en,options,generator_context);
  }
  std::__cxx11::string::~string((string *)local_120);
  io::Printer::~Printer((Printer *)((long)&fullname.field_2 + 8));
  std::
  unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
  ::~unique_ptr(&local_50);
  std::__cxx11::string::~string((string *)&output);
  return;
}

Assistant:

void GenerateEnumFile(const FileDescriptor* file, const EnumDescriptor* en,
                      const Options& options,
                      GeneratorContext* generator_context) {
  std::string filename = GeneratedClassFileName(en, options);
  std::unique_ptr<io::ZeroCopyOutputStream> output(
      generator_context->Open(filename));
  io::Printer printer(output.get(), '^');

  GenerateHead(file, &printer);

  std::string fullname = FilenameToClassname(filename);
  int lastindex = fullname.find_last_of("\\");

  if (lastindex != std::string::npos) {
    printer.Print(
        "namespace ^name^;\n\n",
        "name", fullname.substr(0, lastindex));

    // We only need this 'use' statement if the enum has a namespace.
    // Otherwise, we get a warning that the use statement has no effect.
    printer.Print("use UnexpectedValueException;\n\n");
  }

  GenerateEnumDocComment(&printer, en, options);

  if (lastindex != std::string::npos) {
    fullname = fullname.substr(lastindex + 1);
  }

  printer.Print(
      "class ^name^\n"
      "{\n",
      "name", fullname);
  Indent(&printer);

  for (int i = 0; i < en->value_count(); i++) {
    const EnumValueDescriptor* value = en->value(i);
    GenerateEnumValueDocComment(&printer, value);
    printer.Print("const ^name^ = ^number^;\n",
                  "name", ConstantNamePrefix(value->name()) + value->name(),
                  "number", IntToString(value->number()));
  }

  printer.Print("\nprivate static $valueToName = [\n");
  Indent(&printer);
  for (int i = 0; i < en->value_count(); i++) {
    const EnumValueDescriptor* value = en->value(i);
    printer.Print("self::^name^ => '^name^',\n",
                  "name", ConstantNamePrefix(value->name()) + value->name());
  }
  Outdent(&printer);
  printer.Print("];\n");

  printer.Print(
      "\npublic static function name($value)\n"
      "{\n");
  Indent(&printer);
  printer.Print("if (!isset(self::$valueToName[$value])) {\n");
  Indent(&printer);
  printer.Print("throw new UnexpectedValueException(sprintf(\n");
  Indent(&printer);
  Indent(&printer);
  printer.Print("'Enum %s has no name defined for value %s', __CLASS__, $value));\n");
  Outdent(&printer);
  Outdent(&printer);
  Outdent(&printer);
  printer.Print("}\n"
                "return self::$valueToName[$value];\n");
  Outdent(&printer);
  printer.Print("}\n\n");

  printer.Print(
      "\npublic static function value($name)\n"
      "{\n");
  Indent(&printer);
  printer.Print("$const = __CLASS__ . '::' . strtoupper($name);\n"
                "if (!defined($const)) {\n");
  Indent(&printer);
  printer.Print("throw new UnexpectedValueException(sprintf(\n");
  Indent(&printer);
  Indent(&printer);
  printer.Print("'Enum %s has no value defined for name %s', __CLASS__, $name));\n");
  Outdent(&printer);
  Outdent(&printer);
  Outdent(&printer);
  printer.Print("}\n"
                "return constant($const);\n");
  Outdent(&printer);
  printer.Print("}\n");

  Outdent(&printer);
  printer.Print("}\n\n");

  // write legacy file for backwards compatibility with nested messages and enums
  if (en->containing_type() != NULL) {
    printer.Print(
        "// Adding a class alias for backwards compatibility with the previous class name.\n");
    printer.Print(
        "class_alias(^new^::class, \\^old^::class);\n\n",
        "new", fullname,
        "old", LegacyFullClassName(en, options));
    LegacyGenerateClassFile(file, en, options, generator_context);
  }
}